

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transacHashMap.h
# Opt level: O1

void __thiscall
myTransacHashMap::myTransacHashMap
          (myTransacHashMap *this,uint tableSize,_func_uint_myString_ptr_uint *hashF,
          uint bucketSizeInBytes)

{
  undefined8 *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  
  this->tableSize = tableSize;
  uVar4 = (ulong)tableSize;
  puVar2 = (ulong *)operator_new__(uVar4 * 0x30 + 8);
  *puVar2 = uVar4;
  if (tableSize != 0) {
    lVar3 = 0;
    do {
      *(undefined ***)
       ((long)&((recordsBucket_chain *)(puVar2 + 1))->_vptr_recordsBucket_chain + lVar3) =
           &PTR__recordsBucket_chain_0010ead8;
      *(undefined ***)((long)puVar2 + lVar3 + 0x10) = &PTR__linkedList_0010eb08;
      puVar1 = (undefined8 *)((long)puVar2 + lVar3 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)puVar2 + lVar3 + 0x28) = 0;
      *(undefined4 *)((long)puVar2 + lVar3 + 0x30) = 0;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 * 0x30 != lVar3);
  }
  this->table = (recordsBucket_chain *)(puVar2 + 1);
  *(uint *)(puVar2 + 6) = bucketSizeInBytes >> 6;
  this->hashFunc = hashF;
  return;
}

Assistant:

myTransacHashMap(unsigned tableSize ,unsigned (*hashF)(const myString&, unsigned)  ,unsigned bucketSizeInBytes) {

        this->tableSize = tableSize;

        table = new recordsBucket_chain  [tableSize] ;

        unsigned maxNumberOfRecordsInBucket = bucketSizeInBytes/sizeof(record);

        table->setMaxNumberOfRecordsInBucket(maxNumberOfRecordsInBucket);

        this->hashFunc = hashF;

    }